

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  value_type this_00;
  unsigned_long *val1;
  AssertHelper *this_01;
  long in_RDI;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  int i_3;
  AssertionResult gtest_ar_3;
  int i_2;
  AssertionResult gtest_ar_2;
  TypeParam ht2;
  AssertionResult gtest_ar_1;
  int i_1;
  int pre_copies;
  AssertionResult gtest_ar;
  int i;
  int kThreshold;
  float kResize;
  size_type kSize;
  float in_stack_fffffffffffffb98;
  float in_stack_fffffffffffffb9c;
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffba0;
  HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffba8;
  hasher *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  int line;
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffbc0;
  key_type in_stack_fffffffffffffbc8;
  Type type;
  AssertHelper *in_stack_fffffffffffffbd0;
  Message *in_stack_fffffffffffffc18;
  Message *message;
  AssertHelper *in_stack_fffffffffffffc20;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *this_02;
  AssertionResult local_388 [6];
  value_type *in_stack_fffffffffffffcd8;
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffce0;
  AssertionResult local_300;
  key_type local_2ec;
  int local_2e4;
  size_type local_2d0;
  AssertionResult local_2c8 [6];
  value_type local_25c;
  int local_254;
  size_type local_240;
  AssertionResult local_238;
  key_type local_228;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_220;
  Message local_210 [25];
  int local_148;
  int local_144;
  AssertionResult local_140 [6];
  value_type local_d8;
  key_type local_d0;
  int local_c8;
  int local_c4;
  size_type local_a0;
  AssertionResult local_98 [6];
  value_type local_2c;
  int local_24;
  key_type local_20;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0x400;
  local_14 = 0x3f4ccccd;
  local_18 = 0x332;
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_resizing_parameters
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98);
  local_20 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffba8,(int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffba0,
                    (key_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  for (local_24 = 0; local_24 < 0x333; local_24 = local_24 + 1) {
    local_2c = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),0);
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  local_a0 = google::
             BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0x1035a70);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0,
             (unsigned_long *)in_stack_fffffffffffffba8,(unsigned_long *)in_stack_fffffffffffffba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1035ad7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8.second,
               (char *)in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
               (char *)in_stack_fffffffffffffbb0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
    testing::Message::~Message((Message *)0x1035b3a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1035bab);
  local_c4 = google::
             HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::num_table_copies((HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                 *)(in_RDI + 0x10));
  for (local_c8 = 0; local_c8 < 0x400; local_c8 = local_c8 + 1) {
    local_d0 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffba8,(int)((ulong)in_stack_fffffffffffffba0 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffba0,
            (key_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    local_d8 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),0);
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  local_144 = google::
              HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::num_table_copies((HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                  *)(in_RDI + 0x10));
  local_148 = local_c4 + 2;
  testing::internal::CmpHelperLT<int,int>
            (in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0,
             (int *)in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_140);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1035d13);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8.second,
               (char *)in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
               (char *)in_stack_fffffffffffffbb0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
    testing::Message::~Message((Message *)0x1035d76);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1035de7);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffba0,(int)in_stack_fffffffffffffb9c);
  message = local_210;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffba0,(int)in_stack_fffffffffffffb9c);
  this_02 = &local_220;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(this_02,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (in_stack_fffffffffffffbc0,(size_type)in_stack_fffffffffffffbb8,
             in_stack_fffffffffffffbb0,(key_equal *)in_stack_fffffffffffffba8,
             (allocator_type *)in_stack_fffffffffffffba0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_220);
  local_228 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffba8,(int)((ulong)in_stack_fffffffffffffba0 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffba0,
                    (key_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_resizing_parameters
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98);
  local_240 = google::
              BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0x1035ed2);
  testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0,
             (unsigned_long *)in_stack_fffffffffffffba8,(unsigned_long *)in_stack_fffffffffffffba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1035f98);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8.second,
               (char *)in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
               (char *)in_stack_fffffffffffffbb0);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_02,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
    testing::Message::~Message((Message *)0x1035ff5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1036066);
  for (local_254 = 0; local_254 < 0x333; local_254 = local_254 + 1) {
    local_25c = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),0);
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  local_2d0 = google::
              BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0x10360fb);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0,
             (unsigned_long *)in_stack_fffffffffffffba8,(unsigned_long *)in_stack_fffffffffffffba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    in_stack_fffffffffffffbd0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1036170);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8.second,
               (char *)in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
               (char *)in_stack_fffffffffffffbb0);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_02,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
    testing::Message::~Message((Message *)0x10361cd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x103623e);
  for (local_2e4 = 0; type = in_stack_fffffffffffffbc8.second, local_2e4 < 0x333;
      local_2e4 = local_2e4 + 1) {
    in_stack_fffffffffffffbc8 =
         HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(in_stack_fffffffffffffba8,(int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
    local_2ec = in_stack_fffffffffffffbc8;
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffba0,
            (key_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    in_stack_fffffffffffffbc0 =
         (HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)google::
            BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0x10362a8);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0,
               (unsigned_long *)in_stack_fffffffffffffba8,(unsigned_long *)in_stack_fffffffffffffba0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_300);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
      in_stack_fffffffffffffbb8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x103632f);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8.second,
                 (char *)in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                 (char *)in_stack_fffffffffffffbb0);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_02,message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
      testing::Message::~Message((Message *)0x103638c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10363f7);
  }
  this_00 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),0);
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)this_00,in_stack_fffffffffffffcd8);
  val1 = (unsigned_long *)
         google::
         BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)0x1036471);
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffbb8,(char *)this_00,val1,
             (unsigned_long *)in_stack_fffffffffffffba0);
  line = (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_388);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffbd0);
    this_01 = (AssertHelper *)
              testing::AssertionResult::failure_message((AssertionResult *)0x10364e6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffbd0,type,(char *)in_stack_fffffffffffffbc0,line,(char *)this_00
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)this_02,message);
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0x1036543);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10365ae);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0x10365bb);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeActuallyResizes) {
  // This tests for a problem we had where we could repeatedly "resize"
  // a hashtable to the same size it was before, on every insert.
  const typename TypeParam::size_type kSize = 1 << 10;  // Pick any power of 2
  const float kResize = 0.8f;  // anything between 0.5 and 1 is fine.
  const int kThreshold = static_cast<int>(kSize * kResize - 1);
  this->ht_.set_resizing_parameters(0, kResize);
  this->ht_.set_deleted_key(this->UniqueKey(kThreshold + 100));

  // Get right up to the resizing threshold.
  for (int i = 0; i <= kThreshold; i++) {
    this->ht_.insert(this->UniqueObject(i + 1));
  }
  // The bucket count should equal kSize.
  EXPECT_EQ(kSize, this->ht_.bucket_count());

  // Now start doing erase+insert pairs.  This should cause us to
  // copy the hashtable at most once.
  const int pre_copies = this->ht_.num_table_copies();
  for (int i = 0; i < static_cast<int>(kSize); i++) {
    this->ht_.erase(this->UniqueKey(kThreshold));
    this->ht_.insert(this->UniqueObject(kThreshold));
  }
  EXPECT_LT(this->ht_.num_table_copies(), pre_copies + 2);

  // Now create a hashtable where we go right to the threshold, then
  // delete everything and do one insert.  Even though our hashtable
  // is now tiny, we should still have at least kSize buckets, because
  // our shrink threshhold is 0.
  TypeParam ht2;
  ht2.set_deleted_key(this->UniqueKey(kThreshold + 100));
  ht2.set_resizing_parameters(0, kResize);
  EXPECT_LT(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.insert(this->UniqueObject(i + 1));
  }
  EXPECT_EQ(ht2.bucket_count(), kSize);
  for (int i = 0; i <= kThreshold; i++) {
    ht2.erase(this->UniqueKey(i + 1));
    EXPECT_EQ(ht2.bucket_count(), kSize);
  }
  ht2.insert(this->UniqueObject(kThreshold + 2));
  EXPECT_GE(ht2.bucket_count(), kSize);
}